

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall IRBuilder::InsertBailOnNoProfile(IRBuilder *this,uint offset)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *ppIVar5;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  int iVar7;
  Instr *insertBeforeInstr;
  Iterator local_40;
  
  bVar3 = DoBailOnNoProfile(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x84,"(DoBailOnNoProfile())","DoBailOnNoProfile()");
    if (!bVar3) goto LAB_004c03ee;
    *puVar4 = 0;
  }
  if (this->callTreeHasSomeProfileInfo == false) {
    pSVar6 = this->m_argStack;
    local_40.list = &pSVar6->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>;
    local_40.current = (NodeBase *)pSVar6;
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    insertBeforeInstr = (Instr *)0x0;
    iVar7 = 0;
    while( true ) {
      if (pSVar6 == (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) goto LAB_004c03ee;
        *puVar4 = 0;
        pSVar6 = (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      }
      pSVar6 = (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
               (pSVar6->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
               super_SListNodeBase<Memory::ArenaAllocator>.next;
      if (pSVar6 == (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)local_40.list) break;
      local_40.current = (NodeBase *)pSVar6;
      ppIVar5 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data(&local_40)
      ;
      OVar1 = (*ppIVar5)->m_opcode;
      if ((OVar1 == StartCall) && (1 < iVar7 + 1)) {
        return;
      }
      pSVar6 = (SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)local_40.current;
      if (OVar1 == StartCall) {
        insertBeforeInstr = *ppIVar5;
        iVar7 = iVar7 + 1;
      }
    }
    if (insertBeforeInstr == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0x9a,"(startCall)","startCall");
      if (!bVar3) {
LAB_004c03ee:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    if (insertBeforeInstr->m_prev->m_opcode != BailOnNoProfile) {
      InsertBailOnNoProfile(this,insertBeforeInstr);
    }
  }
  return;
}

Assistant:

void
IRBuilder::InsertBailOnNoProfile(uint offset)
{
    Assert(DoBailOnNoProfile());

    if (this->callTreeHasSomeProfileInfo)
    {
        return;
    }

    IR::Instr *startCall = nullptr;
    int count = 0;
    FOREACH_SLIST_ENTRY(IR::Instr *, argInstr, this->m_argStack)
    {
        if (argInstr->m_opcode == Js::OpCode::StartCall)
        {
            startCall = argInstr;
            count++;
            if (count > 1)
            {
                return;
            }
        }
    } NEXT_SLIST_ENTRY;

    AnalysisAssert(startCall);

    if (startCall->m_prev->m_opcode != Js::OpCode::BailOnNoProfile)
    {
        InsertBailOnNoProfile(startCall);
    }
}